

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cc
# Opt level: O0

Status __thiscall leveldb::ReadFileToString(leveldb *this,Env *env,string *fname,string *data)

{
  SequentialFile *pSVar1;
  bool bVar2;
  char *pcVar3;
  Status local_68;
  undefined1 local_60 [8];
  Slice fragment;
  char *space;
  long *local_30;
  SequentialFile *file;
  string *data_local;
  string *fname_local;
  Env *env_local;
  Status *s;
  
  file = (SequentialFile *)data;
  data_local = fname;
  fname_local = (string *)env;
  env_local = (Env *)this;
  std::__cxx11::string::clear();
  (**(code **)(*(long *)fname_local + 0x10))(this,fname_local,data_local,&local_30);
  bVar2 = Status::ok((Status *)this);
  if (bVar2) {
    fragment.size_ = (size_t)operator_new__(0x2000);
    do {
      Slice::Slice((Slice *)local_60);
      (**(code **)(*local_30 + 0x10))(&local_68,local_30,0x2000,local_60,fragment.size_);
      Status::operator=((Status *)this,&local_68);
      Status::~Status(&local_68);
      bVar2 = Status::ok((Status *)this);
      pSVar1 = file;
      if (!bVar2) break;
      pcVar3 = Slice::data((Slice *)local_60);
      Slice::size((Slice *)local_60);
      std::__cxx11::string::append((char *)pSVar1,(ulong)pcVar3);
      bVar2 = Slice::empty((Slice *)local_60);
    } while (!bVar2);
    if (fragment.size_ != 0) {
      operator_delete__((void *)fragment.size_);
    }
    if (local_30 != (long *)0x0) {
      (**(code **)(*local_30 + 8))();
    }
  }
  return (Status)(char *)this;
}

Assistant:

Status ReadFileToString(Env *env, const std::string &fname, std::string *data) {
        data->clear();
        SequentialFile *file;
        Status s = env->NewSequentialFile(fname, &file);
        if (!s.ok()) {
            return s;
        }
        static const int kBufferSize = 8192;
        char *space = new char[kBufferSize];
        while (true) {
            Slice fragment;
            s = file->Read(kBufferSize, &fragment, space);
            if (!s.ok()) {
                break;
            }
            data->append(fragment.data(), fragment.size());
            if (fragment.empty()) {
                break;
            }
        }
        delete[] space;
        delete file;
        return s;
    }